

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

ListReader * __thiscall
capnp::_::PointerReader::getListAnySize
          (ListReader *__return_storage_ptr__,PointerReader *this,word *defaultValue)

{
  ushort uVar1;
  unsigned_short uVar2;
  StructDataBitCount SVar3;
  word *pwVar4;
  CapTableReader *pCVar5;
  Arena *pAVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int *piVar10;
  ElementSize EVar11;
  ulong uVar12;
  uint uVar13;
  WirePointer *pWVar14;
  WirePointer *pWVar15;
  long lVar16;
  char *pcVar17;
  ulong uVar18;
  WirePointer *pWVar19;
  WirePointer *pWVar20;
  char *pcVar21;
  DebugComparison<int_&,_int> *this_00;
  bool bVar22;
  Exception *local_78;
  Fault f;
  int local_64;
  DebugComparison<int_&,_int> _kjCondition;
  Fault f_3;
  
  pWVar14 = (WirePointer *)&(anonymous_namespace)::zero;
  if (this->pointer != (WirePointer *)0x0) {
    pWVar14 = this->pointer;
  }
  local_78 = (Exception *)this->segment;
  local_64 = this->nestingLimit;
  pWVar15 = pWVar14 + 1;
  iVar8 = (int)*(uint64_t *)&(pWVar14->offsetAndKind).value;
  lVar16 = (long)(iVar8 >> 2);
  pWVar19 = pWVar15 + lVar16;
  if (((local_78 != (Exception *)0x0) &&
      (pwVar4 = ((ArrayPtr<const_capnp::word> *)&(local_78->ownFile).content.disposer)->ptr,
      pWVar20 = (WirePointer *)(pwVar4 + (long)local_78->file), pWVar19 = pWVar20,
      (long)pwVar4 - (long)pWVar15 >> 3 <= lVar16)) &&
     (pWVar19 = pWVar15 + lVar16, (long)pWVar20 - (long)pWVar15 >> 3 < lVar16)) {
    pWVar19 = pWVar20;
  }
  pCVar5 = this->capTable;
  if (iVar8 != 0 || (pWVar14->field_1).upper32Bits != 0) goto LAB_0017a0ab;
LAB_0017a075:
  do {
    pWVar14 = (WirePointer *)defaultValue;
    if ((pWVar14 == (WirePointer *)0x0) ||
       (iVar8 = (int)*(uint64_t *)&(pWVar14->offsetAndKind).value,
       (pWVar14->field_1).upper32Bits == 0 && iVar8 == 0)) {
      __return_storage_ptr__->ptr = (byte *)0x0;
      __return_storage_ptr__->elementCount = 0;
      __return_storage_ptr__->step = 0;
      __return_storage_ptr__->segment = (SegmentReader *)0x0;
      __return_storage_ptr__->capTable = (CapTableReader *)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->step + 3) = 0;
      __return_storage_ptr__->nestingLimit = 0x7fffffff;
      return __return_storage_ptr__;
    }
    local_78 = (Exception *)0x0;
    pWVar19 = pWVar14 + (long)(iVar8 >> 2) + 1;
    defaultValue = (word *)0x0;
LAB_0017a0ab:
    _kjCondition._8_8_ = (ulong)(uint)_kjCondition._12_4_ << 0x20;
    _kjCondition.left = &local_64;
    _kjCondition.op.content.ptr = " > ";
    _kjCondition.op.content.size_ = 4;
    _kjCondition.result = 0 < local_64;
    if (local_64 < 1) {
      this_00 = (DebugComparison<int_&,_int> *)&f;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&,char_const(&)[76]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x8e6,FAILED,"nestingLimit > 0",
                 "_kjCondition,\"Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.\""
                 ,&_kjCondition,
                 (char (*) [76])
                 "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.");
      goto LAB_0017a739;
    }
    pWVar15 = pWVar14;
    if ((local_78 == (Exception *)0x0) || ((*(uint64_t *)&(pWVar14->offsetAndKind).value & 3) != 2))
    goto LAB_0017a3c8;
    pAVar6 = (Arena *)(local_78->ownFile).content.ptr;
    iVar8 = (*pAVar6->_vptr_Arena[2])(pAVar6,(ulong)(pWVar14->field_1).upper32Bits);
    local_78 = (Exception *)CONCAT44(extraout_var,iVar8);
    _kjCondition.right = 0;
    _kjCondition._12_4_ = 0;
    _kjCondition.op.content.ptr = " != ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = local_78 != (Exception *)0x0;
    if (local_78 == (Exception *)0x0) {
      this_00 = (DebugComparison<int_&,_int> *)&f;
      _kjCondition.left = (int *)&local_78;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[49]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x244,FAILED,"segment != nullptr",
                 "_kjCondition,\"Message contains far pointer to unknown segment.\"",
                 (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&_kjCondition,
                 (char (*) [49])"Message contains far pointer to unknown segment.");
      goto LAB_0017a739;
    }
    uVar9 = (uint)*(uint64_t *)&(pWVar14->offsetAndKind).value;
    pcVar21 = (char *)(ulong)(uVar9 >> 3);
    pcVar17 = local_78->file;
    if ((long)pcVar17 < (long)pcVar21) {
      pcVar21 = pcVar17;
    }
    uVar12 = 2 - (ulong)((uVar9 & 4) == 0);
    _kjCondition.left = (int *)&local_78;
    if (pcVar17 < pcVar21 + uVar12) {
LAB_0017a163:
      f.exception = f.exception & 0xffffffffffffff00;
      this_00 = &_kjCondition;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[318]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x24d,FAILED,"boundsCheck(segment, ptr, padWords)",
                 "_kjCondition,\"Message contains out-of-bounds far pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                 ,(DebugExpression<bool> *)&f,
                 (char (*) [318])
                 "Message contains out-of-bounds far pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                );
      goto LAB_0017a739;
    }
    pWVar15 = (WirePointer *)
              (((ArrayPtr<const_capnp::word> *)&(local_78->ownFile).content.disposer)->ptr +
              (long)pcVar21);
    uVar18 = (*(ReadLimiter **)&local_78->line)->limit;
    if (uVar18 < uVar12) {
      _kjCondition.left = (int *)&local_78;
      (*((Arena *)(local_78->ownFile).content.ptr)->_vptr_Arena[3])();
      goto LAB_0017a163;
    }
    (*(ReadLimiter **)&local_78->line)->limit = uVar18 - uVar12;
    if ((*(uint64_t *)&(pWVar14->offsetAndKind).value & 4) == 0) {
      pWVar14 = pWVar15 + 1;
      uVar9 = (uint)*(uint64_t *)&(pWVar15->offsetAndKind).value;
      lVar16 = (long)((int)uVar9 >> 2);
      pWVar20 = pWVar14 + lVar16;
      if ((local_78 != (Exception *)0x0) &&
         ((pwVar4 = ((ArrayPtr<const_capnp::word> *)&(local_78->ownFile).content.disposer)->ptr,
          pWVar19 = (WirePointer *)(pwVar4 + (long)local_78->file),
          lVar16 < (long)pwVar4 - (long)pWVar14 >> 3 ||
          ((long)pWVar19 - (long)pWVar14 >> 3 < lVar16)))) goto LAB_0017a3c8;
      goto LAB_0017a3d7;
    }
    pAVar6 = (Arena *)(local_78->ownFile).content.ptr;
    _kjCondition.left = (int *)&local_78;
    iVar8 = (*pAVar6->_vptr_Arena[2])(pAVar6,(ulong)(pWVar15->field_1).upper32Bits);
    f.exception = (Exception *)CONCAT44(extraout_var_00,iVar8);
    _kjCondition.left = (int *)&f;
    _kjCondition.right = 0;
    _kjCondition._12_4_ = 0;
    _kjCondition.op.content.ptr = " != ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = f.exception != (Exception *)0x0;
    if (f.exception == (Exception *)0x0) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[56]>
                (&f_3,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x25f,FAILED,"newSegment != nullptr",
                 "_kjCondition,\"Message contains double-far pointer to unknown segment.\"",
                 (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&_kjCondition,
                 (char (*) [56])"Message contains double-far pointer to unknown segment.");
    }
    else {
      uVar9 = (uint)*(uint64_t *)&(pWVar15->offsetAndKind).value & 3;
      _kjCondition.left = (int *)CONCAT44(2,uVar9);
      _kjCondition._8_8_ = anon_var_dwarf_48c59;
      _kjCondition.op.content.ptr = (char *)0x5;
      _kjCondition.op.content.size_ = (size_t)(uVar9 == 2);
      if (uVar9 == 2) {
        pcVar17 = (char *)(ulong)((uint)*(uint64_t *)&(pWVar15->offsetAndKind).value >> 3);
        if ((long)(f.exception)->file < (long)pcVar17) {
          pcVar17 = (f.exception)->file;
        }
        pWVar19 = (WirePointer *)
                  (((ArrayPtr<const_capnp::word> *)&((f.exception)->ownFile).content.disposer)->ptr
                  + (long)pcVar17);
        pWVar15 = pWVar15 + 1;
        local_78 = f.exception;
        goto LAB_0017a3c8;
      }
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
                (&f_3,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x263,FAILED,"pad->kind() == WirePointer::FAR",
                 "_kjCondition,\"Second word of double-far pad must be far pointer.\"",
                 (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                 &_kjCondition,(char (*) [51])"Second word of double-far pad must be far pointer.");
    }
    pWVar19 = (WirePointer *)0x0;
    kj::_::Debug::Fault::~Fault(&f_3);
    pWVar15 = pWVar15 + 1;
LAB_0017a3c8:
  } while (pWVar19 == (WirePointer *)0x0);
  uVar9 = (uint)*(uint64_t *)&(pWVar15->offsetAndKind).value;
  pWVar20 = pWVar19;
LAB_0017a3d7:
  uVar9 = uVar9 & 3;
  _kjCondition.left = (int *)CONCAT44(1,uVar9);
  _kjCondition._8_8_ = anon_var_dwarf_48c59;
  _kjCondition.op.content.ptr = (char *)0x5;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar9 == 1);
  if (uVar9 != 1) {
    this_00 = (DebugComparison<int_&,_int> *)&f;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[84]>
              ((Fault *)this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x8f3,FAILED,"ref->kind() == WirePointer::LIST",
               "_kjCondition,\"Schema mismatch: Message contains non-list pointer where list pointer was \" \"expected.\""
               ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                &_kjCondition,
               (char (*) [84])
               "Schema mismatch: Message contains non-list pointer where list pointer was expected."
              );
    goto LAB_0017a739;
  }
  uVar9 = (pWVar15->field_1).upper32Bits;
  EVar11 = (ElementSize)uVar9 & INLINE_COMPOSITE;
  if (EVar11 == INLINE_COMPOSITE) {
    f_3.exception._0_4_ = uVar9 >> 3;
    if (local_78 == (Exception *)0x0) {
LAB_0017a5d5:
      uVar9 = (uint)*(uint64_t *)&(pWVar20->offsetAndKind).value;
      bVar22 = (uVar9 & 3) == 0;
      _kjCondition.left = (int *)((ulong)uVar9 & 0xffffffff00000003);
      _kjCondition._8_8_ = anon_var_dwarf_48c59;
      _kjCondition.op.content.ptr = (char *)0x5;
      _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,bVar22);
      if (!bVar22) {
        this_00 = (DebugComparison<int_&,_int> *)&f;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[61]>
                  ((Fault *)this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x907,FAILED,"tag->kind() == WirePointer::STRUCT",
                   "_kjCondition,\"INLINE_COMPOSITE lists of non-STRUCT type are not supported.\"",
                   (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                   &_kjCondition,
                   (char (*) [61])"INLINE_COMPOSITE lists of non-STRUCT type are not supported.");
        goto LAB_0017a739;
      }
      uVar9 = (uint)*(uint64_t *)&(pWVar20->offsetAndKind).value >> 2 & 0x1fffffff;
      uVar12 = (ulong)uVar9;
      uVar13 = (uint)(pWVar20->field_1).structRef.ptrCount.value +
               (uint)(pWVar20->field_1).structRef.dataSize.value;
      _kjCondition.left = (int *)(uVar13 * uVar12);
      _kjCondition._8_8_ = &f_3;
      _kjCondition.op.content.ptr = " <= ";
      piVar10 = (int *)(ulong)(uint)f_3.exception;
      _kjCondition.op.content.size_ = 5;
      bVar22 = (long)_kjCondition.left - (long)piVar10 == 0;
      _kjCondition.result = _kjCondition.left < piVar10 || bVar22;
      if (_kjCondition.left >= piVar10 && !bVar22) {
        this_00 = (DebugComparison<int_&,_int> *)&f;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int&>&,char_const(&)[57]>
                  ((Fault *)this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x90f,FAILED,"upgradeBound<uint64_t>(size) * wordsPerElement <= wordCount",
                   "_kjCondition,\"INLINE_COMPOSITE list\'s elements overrun its word count.\"",
                   (DebugComparison<unsigned_long,_unsigned_int_&> *)&_kjCondition,
                   (char (*) [57])"INLINE_COMPOSITE list\'s elements overrun its word count.");
        goto LAB_0017a739;
      }
      if (uVar13 == 0) {
        if (local_78 == (Exception *)0x0) {
          local_78 = (Exception *)0x0;
        }
        else {
          uVar18 = (*(ReadLimiter **)&local_78->line)->limit;
          if (uVar18 < uVar12) {
            (*((Arena *)(local_78->ownFile).content.ptr)->_vptr_Arena[3])();
            pcVar17 = "amplifiedRead(segment, size * (ONE * WORDS / ELEMENTS))";
            iVar8 = 0x917;
            goto LAB_0017a7ea;
          }
          (*(ReadLimiter **)&local_78->line)->limit = uVar18 - uVar12;
        }
      }
      uVar1 = (pWVar20->field_1).structRef.dataSize.value;
      uVar2 = (pWVar20->field_1).structRef.ptrCount.value;
      __return_storage_ptr__->segment = (SegmentReader *)local_78;
      __return_storage_ptr__->capTable = pCVar5;
      __return_storage_ptr__->ptr = (byte *)(pWVar20 + 1);
      __return_storage_ptr__->elementCount = uVar9;
      __return_storage_ptr__->step = uVar13 * 0x40;
      __return_storage_ptr__->structDataSize = (uint)uVar1 << 6;
      __return_storage_ptr__->structPointerCount = uVar2;
      __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
code_r0x0017a6cb:
      __return_storage_ptr__->nestingLimit = local_64 + -1;
      return __return_storage_ptr__;
    }
    if ((char *)(((long)pWVar20 -
                  (long)((ArrayPtr<const_capnp::word> *)&(local_78->ownFile).content.disposer)->ptr
                 >> 3) + (ulong)(uint)f_3.exception + 1) <= local_78->file) {
      uVar12 = (ulong)(uint)f_3.exception + 1;
      uVar18 = (*(ReadLimiter **)&local_78->line)->limit;
      if (uVar12 <= uVar18) {
        (*(ReadLimiter **)&local_78->line)->limit = uVar18 - uVar12;
        goto LAB_0017a5d5;
      }
      (*((Arena *)(local_78->ownFile).content.ptr)->_vptr_Arena[3])();
    }
    pcVar17 = "boundsCheck(segment, ptr, wordCount + POINTER_SIZE_IN_WORDS)";
    iVar8 = 0x900;
  }
  else {
    SVar3 = *(StructDataBitCount *)(BITS_PER_ELEMENT_TABLE + ((ulong)uVar9 & 7) * 4);
    uVar12 = (ulong)(uVar9 >> 3);
    uVar13 = (uint)(EVar11 == POINTER) * 0x40 + SVar3;
    if (local_78 == (Exception *)0x0) {
LAB_0017a74a:
      local_78 = (Exception *)0x0;
      goto LAB_0017a58a;
    }
    uVar18 = uVar13 * uVar12 + 0x3f >> 6 & 0xffffffff;
    if ((char *)(((long)pWVar20 -
                  (long)((ArrayPtr<const_capnp::word> *)&(local_78->ownFile).content.disposer)->ptr
                 >> 3) + uVar18) <= local_78->file) {
      uVar7 = (*(ReadLimiter **)&local_78->line)->limit;
      if (uVar18 <= uVar7) {
        (*(ReadLimiter **)&local_78->line)->limit = uVar7 - uVar18;
        if ((uVar9 & 7) != 0) {
LAB_0017a58a:
          __return_storage_ptr__->segment = (SegmentReader *)local_78;
          __return_storage_ptr__->capTable = pCVar5;
          __return_storage_ptr__->ptr = (byte *)pWVar20;
          __return_storage_ptr__->elementCount = uVar9 >> 3;
          __return_storage_ptr__->step = uVar13;
          __return_storage_ptr__->structDataSize = SVar3;
          __return_storage_ptr__->structPointerCount = (ushort)(EVar11 == POINTER);
          __return_storage_ptr__->elementSize = EVar11;
          goto code_r0x0017a6cb;
        }
        if (local_78 == (Exception *)0x0) goto LAB_0017a74a;
        uVar18 = (*(ReadLimiter **)&local_78->line)->limit;
        if (uVar12 <= uVar18) {
          (*(ReadLimiter **)&local_78->line)->limit = uVar18 - uVar12;
          goto LAB_0017a58a;
        }
        (*((Arena *)(local_78->ownFile).content.ptr)->_vptr_Arena[3])();
        pcVar17 = "amplifiedRead(segment, elementCount * (ONE * WORDS / ELEMENTS))";
        iVar8 = 0x960;
LAB_0017a7ea:
        f.exception = f.exception & 0xffffffffffffff00;
        this_00 = &_kjCondition;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[41]>
                  ((Fault *)&_kjCondition,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,iVar8,FAILED,pcVar17,"_kjCondition,\"Message contains amplified list pointer.\""
                   ,(DebugExpression<bool> *)&f,
                   (char (*) [41])"Message contains amplified list pointer.");
        goto LAB_0017a739;
      }
      (*((Arena *)(local_78->ownFile).content.ptr)->_vptr_Arena[3])();
    }
    pcVar17 = "boundsCheck(segment, ptr, wordCount)";
    iVar8 = 0x958;
  }
  f.exception = f.exception & 0xffffffffffffff00;
  this_00 = &_kjCondition;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[319]>
            ((Fault *)&_kjCondition,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
             ,iVar8,FAILED,pcVar17,
             "_kjCondition,\"Message contains out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
             ,(DebugExpression<bool> *)&f,
             (char (*) [319])
             "Message contains out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
            );
LAB_0017a739:
  kj::_::Debug::Fault::~Fault((Fault *)this_00);
  goto LAB_0017a075;
}

Assistant:

ListReader PointerReader::getListAnySize(const word* defaultValue) const {
  const WirePointer* ref = pointer == nullptr ? &zero.pointer : pointer;
  return WireHelpers::readListPointer(
      segment, capTable, ref, defaultValue, ElementSize::VOID /* dummy */, nestingLimit, false);
}